

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O2

bool __thiscall QGroupBoxPrivate::shouldHandleKeyEvent(QGroupBoxPrivate *this,QKeyEvent *keyEvent)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<Qt::Key> local_58;
  anon_union_24_3_e3d07ef4_for_data local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidgetPrivate).field_0x8;
  if ((((*(byte *)(*(long *)(lVar1 + 0x20) + 8) & 1) == 0) &&
      (*(char *)(*(long *)(lVar1 + 8) + 0x279) == '\x01')) && (-1 < *(short *)(keyEvent + 0x50))) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d._0_4_ = 0xaaaaaaaa;
    local_58.d._4_4_ = 0xaaaaaaaa;
    local_58.ptr._0_4_ = 0xaaaaaaaa;
    local_58.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
              (&local_40,QGuiApplicationPrivate::platform_theme,0x28);
    qvariant_cast<QList<Qt::Key>>((QList<Qt::Key> *)&local_58,(QVariant *)&local_40);
    ::QVariant::~QVariant((QVariant *)&local_40);
    local_40._0_4_ = *(undefined4 *)(keyEvent + 0x40);
    bVar2 = QListSpecialMethodsBase<Qt::Key>::contains<int>
                      ((QListSpecialMethodsBase<Qt::Key> *)&local_58,(int *)local_40.data);
    QArrayDataPointer<Qt::Key>::~QArrayDataPointer(&local_58);
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QGroupBoxPrivate::shouldHandleKeyEvent(const QKeyEvent *keyEvent) const
{
    Q_Q(const QGroupBox);

    if (!q->isEnabled() || !q->isCheckable() || keyEvent->isAutoRepeat())
        return false;

    const QList<Qt::Key> buttonPressKeys = QGuiApplicationPrivate::platformTheme()
                                           ->themeHint(QPlatformTheme::ButtonPressKeys)
                                           .value<QList<Qt::Key>>();
    return buttonPressKeys.contains(keyEvent->key());
}